

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     DefaultPrintTo<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>::Unparsed_const>
               (undefined8 param_1,void *param_2,ostream *param_3)

{
  bool bVar1;
  ostream *os_local;
  Unparsed *p_local;
  IsNotContainer param_0_local;
  
  if (param_2 == (void *)0x0) {
    std::operator<<(param_3,"NULL");
  }
  else {
    bVar1 = IsTrue(true);
    if (bVar1) {
      std::ostream::operator<<(param_3,param_2);
    }
    else {
      std::ostream::operator<<(param_3,param_2);
    }
  }
  return;
}

Assistant:

void DefaultPrintTo(IsNotContainer /* dummy */,
                    true_type /* is a pointer */,
                    T* p, ::std::ostream* os) {
  if (p == NULL) {
    *os << "NULL";
  } else {
    // C++ doesn't allow casting from a function pointer to any object
    // pointer.
    //
    // IsTrue() silences warnings: "Condition is always true",
    // "unreachable code".
    if (IsTrue(ImplicitlyConvertible<T*, const void*>::value)) {
      // T is not a function type.  We just call << to print p,
      // relying on ADL to pick up user-defined << for their pointer
      // types, if any.
      *os << p;
    } else {
      // T is a function type, so '*os << p' doesn't do what we want
      // (it just prints p as bool).  We want to print p as a const
      // void*.  However, we cannot cast it to const void* directly,
      // even using reinterpret_cast, as earlier versions of gcc
      // (e.g. 3.4.5) cannot compile the cast when p is a function
      // pointer.  Casting to UInt64 first solves the problem.
      *os << reinterpret_cast<const void*>(
          reinterpret_cast<internal::UInt64>(p));
    }
  }
}